

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

bool __thiscall GrcSymbolTableEntry::IsIgnorableOffsetAttr(GrcSymbolTableEntry *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = IsSequenceAttr(this);
  if (bVar1) {
    bVar2 = false;
  }
  else {
    bVar1 = std::operator==(&this->m_staFieldName,"gpoint");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==(&this->m_staFieldName,"xoffset");
      if (!bVar1) {
        bVar1 = std::operator==(&this->m_staFieldName,"yoffset");
        return bVar1;
      }
    }
  }
  return bVar2;
}

Assistant:

bool GrcSymbolTableEntry::IsIgnorableOffsetAttr()
{
	Assert(FitsSymbolType(ksymtGlyphAttr));
	//Symbol psymParent = ParentSymbol();
	return (!IsSequenceAttr()
		&& (m_staFieldName == "gpoint" || m_staFieldName == "xoffset"
				|| m_staFieldName == "yoffset"));
}